

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_profile_ret(jit_State *J)

{
  jit_State *J_local;
  
  if (J->prof_mode == 0x66) {
    (J->fold).ins.field_0.ot = 0x1580;
    (J->fold).ins.field_0.op1 = 0;
    (J->fold).ins.field_0.op2 = 0;
    lj_opt_fold(J);
    J->prev_pt = (GCproto *)0x0;
    lj_snap_add(J);
  }
  return;
}

Assistant:

static void rec_profile_ret(jit_State *J)
{
  if (J->prof_mode == 'f') {
    emitir(IRTG(IR_PROF, IRT_NIL), 0, 0);
    J->prev_pt = NULL;
    lj_snap_add(J);
  }
}